

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::~ImFontAtlas(ImFontAtlas *this)

{
  byte *in_RDI;
  undefined1 uVar1;
  undefined7 in_stack_fffffffffffffff0;
  
  uVar1 = (*in_RDI & 1) == 0;
  if (!(bool)uVar1) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x649,"ImFontAtlas::~ImFontAtlas()");
  }
  Clear((ImFontAtlas *)CONCAT17(uVar1,in_stack_fffffffffffffff0));
  ImVector<ImFontConfig>::~ImVector
            ((ImVector<ImFontConfig> *)CONCAT17(uVar1,in_stack_fffffffffffffff0));
  ImVector<ImFontAtlasCustomRect>::~ImVector
            ((ImVector<ImFontAtlasCustomRect> *)CONCAT17(uVar1,in_stack_fffffffffffffff0));
  ImVector<ImFont_*>::~ImVector((ImVector<ImFont_*> *)CONCAT17(uVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

ImFontAtlas::~ImFontAtlas()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    Clear();
}